

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_print(lua_State *L)

{
  char *__ptr;
  char *s;
  size_t l;
  int i;
  int n;
  lua_State *L_local;
  
  _i = L;
  l._4_4_ = lua_gettop(L);
  for (l._0_4_ = 1; (int)l <= l._4_4_; l._0_4_ = (int)l + 1) {
    __ptr = luaL_tolstring(_i,(int)l,(size_t *)&s);
    if (1 < (int)l) {
      fwrite("\t",1,1,_stdout);
    }
    fwrite(__ptr,1,(size_t)s,_stdout);
    lua_settop(_i,-2);
  }
  fwrite("\n",1,1,_stdout);
  fflush(_stdout);
  return 0;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  for (i = 1; i <= n; i++) {  /* for each argument */
    size_t l;
    const char *s = luaL_tolstring(L, i, &l);  /* convert it to string */
    if (i > 1)  /* not the first element? */
      lua_writestring("\t", 1);  /* add a tab before it */
    lua_writestring(s, l);  /* print it */
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}